

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeadNode.h
# Opt level: O0

void __thiscall
duckdb_skiplistlib::skip_list::
HeadNode<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
::_throwValueErrorNotFound
          (HeadNode<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
           *this,pair<unsigned_long,_duckdb::hugeint_t> *value)

{
  string *in_msg;
  string err_msg;
  allocator *this_00;
  allocator local_31;
  string local_30 [48];
  
  this_00 = &local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Value not found.",this_00);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  in_msg = (string *)__cxa_allocate_exception(0x28);
  ValueError::ValueError((ValueError *)this_00,in_msg);
  __cxa_throw(in_msg,&ValueError::typeinfo,ValueError::~ValueError);
}

Assistant:

void HeadNode<T, _Compare>::_throwValueErrorNotFound(const T &value) const {
#ifdef INCLUDE_METHODS_THAT_USE_STREAMS
    std::ostringstream oss;
    oss << "Value " << value << " not found.";
    std::string err_msg = oss.str();
#else
    std::string err_msg = "Value not found.";
#endif
    throw ValueError(err_msg);
}